

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

pair<bool,_Point> intersection(Segment *segment,Sphere *sphere)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  pair<bool,_Point> pVar15;
  
  fVar1 = (segment->a).x;
  fVar9 = (segment->a).y;
  fVar12 = (segment->a).z;
  fVar10 = (segment->b).x - fVar1;
  fVar8 = (segment->b).y - fVar9;
  fVar11 = (segment->b).z - fVar12;
  fVar7 = (sphere->center).x;
  fVar2 = (sphere->center).y;
  fVar3 = (sphere->center).z;
  fVar13 = fVar11 * fVar11 + fVar10 * fVar10 + fVar8 * fVar8;
  fVar14 = (fVar12 - fVar3) * (fVar11 + fVar11) +
           (fVar9 - fVar2) * (fVar8 + fVar8) + (fVar1 - fVar7) * (fVar10 + fVar10);
  fVar6 = fVar3 * fVar12 + fVar7 * fVar1 + fVar9 * fVar2;
  fVar7 = fVar14 * fVar14 +
          fVar13 * -4.0 *
          (((fVar12 * fVar12 +
            fVar9 * fVar9 + fVar1 * fVar1 + fVar3 * fVar3 + fVar7 * fVar7 + fVar2 * fVar2) -
           (fVar6 + fVar6)) - sphere->radius * sphere->radius);
  if ((0.0 <= fVar7) || (ABS(fVar7) < 1.1920929e-07)) {
    if (fVar7 < 0.0) {
      fVar7 = sqrtf(fVar7);
    }
    else {
      fVar7 = SQRT(fVar7);
    }
    fVar7 = (-fVar14 - fVar7) / (fVar13 + fVar13);
    if (0.0 <= fVar7) {
      fVar9 = fVar8 * fVar7 + fVar9;
      fVar12 = fVar11 * fVar7 + fVar12;
      uVar5 = (ulong)(uint)(fVar10 * fVar7 + fVar1) << 0x20;
      uVar4 = 1;
      goto LAB_00107b4e;
    }
  }
  fVar12 = 0.0;
  fVar9 = 0.0;
  uVar4 = 0;
  uVar5 = 0;
LAB_00107b4e:
  pVar15._0_8_ = uVar4 | uVar5;
  pVar15.second.z = fVar12;
  pVar15.second.y = fVar9;
  return pVar15;
}

Assistant:

std::pair<bool, Point> intersection(Segment const& segment, Sphere const& sphere)
{
  float x0 = segment.a.x;
  float y0 = segment.a.y;
  float z0 = segment.a.z;

  float x1 = segment.b.x;
  float y1 = segment.b.y;
  float z1 = segment.b.z;

  float dx = x1 - x0;
  float dy = y1 - y0;
  float dz = z1 - z0;

  float cx = sphere.center.x;
  float cy = sphere.center.y;
  float cz = sphere.center.z;

  float a = dx * dx + dy * dy + dz * dz;
  float b = 2 * dx * (x0 - cx) + 2 * dy * (y0 - cy) + 2 * dz * (z0 - cz);
  float c = cx * cx + cy * cy + cz * cz + x0 * x0 + y0 * y0 + z0 * z0
            - 2 * (cx * x0 + cy * y0 + cz * z0) - sphere.radius * sphere.radius;

  float discriminant = b * b - 4 * a * c;
  if (!isCloseToZero(discriminant) && discriminant < 0)
    return {false, {}};

  float t = (-b - std::sqrt(discriminant)) / (2 * a);
  if (t < 0)
    return {false, {}};

  return {true, {x0 + t * dx, y0 + t * dy, z0 + t * dz}};
}